

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O1

Result<wasm::Ok> *
wasm::WATParser::anon_unknown_2::addExports
          (Result<wasm::Ok> *__return_storage_ptr__,Lexer *in,Module *wasm,Named *item,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *exports,ExternalKind kind)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pNVar3;
  size_type sVar4;
  char *pcVar5;
  char *pcVar6;
  Export *pEVar7;
  ulong uVar8;
  _Alloc_hider _Var9;
  pointer pNVar10;
  Result<wasm::Ok> *pRVar11;
  string local_80;
  Err local_60;
  Result<wasm::Ok> *local_40;
  ExternalKind local_38;
  byte local_31;
  
  pNVar10 = (exports->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pNVar3 = (exports->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_31 = pNVar10 == pNVar3;
  pRVar11 = __return_storage_ptr__;
  if (!(bool)local_31) {
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    local_40 = __return_storage_ptr__;
    local_38 = kind;
    do {
      sVar4 = (pNVar10->super_IString).str._M_len;
      pcVar5 = (pNVar10->super_IString).str._M_str;
      pEVar7 = Module::getExportOrNull(wasm,(Name)(pNVar10->super_IString).str);
      if (pEVar7 == (Export *)0x0) {
        local_60.msg._M_dataplus._M_p = (pointer)operator_new(0x30);
        pcVar6 = (item->name).super_IString.str._M_str;
        *(size_t *)(local_60.msg._M_dataplus._M_p + 0x18) = (item->name).super_IString.str._M_len;
        *(char **)(local_60.msg._M_dataplus._M_p + 0x20) = pcVar6;
        *(size_type *)local_60.msg._M_dataplus._M_p = sVar4;
        *(char **)(local_60.msg._M_dataplus._M_p + 8) = pcVar5;
        *(ExternalKind *)(local_60.msg._M_dataplus._M_p + 0x10) = local_38;
        local_60.msg._M_dataplus._M_p[0x28] = '\0';
        Module::addExport(wasm,(unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                               &local_60);
        pRVar11 = local_40;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60.msg._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          uVar8 = 0x30;
          _Var9._M_p = local_60.msg._M_dataplus._M_p;
          goto LAB_00b8bb6c;
        }
      }
      else {
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,"repeated export name","");
        Lexer::err(&local_60,in,&local_80);
        paVar2 = &local_60.msg.field_2;
        *(undefined8 **)
         &(local_40->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60.msg._M_dataplus._M_p == paVar2) {
          *puVar1 = CONCAT71(local_60.msg.field_2._M_allocated_capacity._1_7_,
                             local_60.msg.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
               local_60.msg.field_2._8_8_;
        }
        else {
          *(pointer *)
           &(local_40->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_60.msg._M_dataplus._M_p;
          *(ulong *)((long)&(local_40->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
               CONCAT71(local_60.msg.field_2._M_allocated_capacity._1_7_,
                        local_60.msg.field_2._M_local_buf[0]);
        }
        *(size_type *)
         ((long)&(local_40->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
             local_60.msg._M_string_length;
        local_60.msg._M_string_length = 0;
        local_60.msg.field_2._M_local_buf[0] = '\0';
        *(__index_type *)
         ((long)&(local_40->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        pRVar11 = local_40;
        local_60.msg._M_dataplus._M_p = (pointer)paVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          uVar8 = local_80.field_2._M_allocated_capacity + 1;
          _Var9._M_p = local_80._M_dataplus._M_p;
LAB_00b8bb6c:
          pRVar11 = local_40;
          operator_delete(_Var9._M_p,uVar8);
        }
      }
      if (pEVar7 != (Export *)0x0) {
        if ((local_31 & 1) == 0) {
          return pRVar11;
        }
        break;
      }
      pNVar10 = pNVar10 + 1;
      local_31 = pNVar10 == pNVar3;
    } while (!(bool)local_31);
  }
  *(__index_type *)
   ((long)&(pRVar11->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  return pRVar11;
}

Assistant:

Result<> addExports(Lexer& in,
                    Module& wasm,
                    const Named* item,
                    const std::vector<Name>& exports,
                    ExternalKind kind) {
  for (auto name : exports) {
    if (wasm.getExportOrNull(name)) {
      // TODO: Fix error location
      return in.err("repeated export name");
    }
    wasm.addExport(Builder(wasm).makeExport(name, item->name, kind));
  }
  return Ok{};
}